

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-reverse-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase89::TestCase89(TestCase89 *this)

{
  TestCase89 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
             ,0x59,"legacy test: EndianReverse/EightBytes");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00cbaf90;
  return;
}

Assistant:

TEST(EndianReverse, EightBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};

  WireValue<uint64_t>* vals = reinterpret_cast<WireValue<uint64_t>*>(bytes);

  EXPECT_EQ(0x123456789abcdef0ull, vals[0].get());

  vals[0].set(0x23456789abcdef01ull);

  EXPECT_EQ(0x23, bytes[0]);
  EXPECT_EQ(0x45, bytes[1]);
  EXPECT_EQ(0x67, bytes[2]);
  EXPECT_EQ(0x89, bytes[3]);
  EXPECT_EQ(0xab, bytes[4]);
  EXPECT_EQ(0xcd, bytes[5]);
  EXPECT_EQ(0xef, bytes[6]);
  EXPECT_EQ(0x01, bytes[7]);
}